

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  const_reference ppLVar2;
  undefined8 *in_RCX;
  long in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Option opt_g_3;
  Layer *op_1;
  Mat top_blob_g_2;
  Mat bottom_blob_bordered_g_1;
  int g_3;
  int num_output_g;
  int channels_g;
  Option opt_g_2;
  Layer *op;
  Mat top_blob_g_1;
  Mat bottom_blob_bordered_g;
  int g_2;
  Mat top_blob_g;
  Option opt_g_1;
  int g_1;
  int outh;
  int outw;
  int hpad;
  int wpad;
  Mat bottom_blob_bordered;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  Option opt_g;
  int g;
  int channels_g_1;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  undefined4 local_338;
  undefined4 uStack_334;
  undefined8 uStack_330;
  undefined8 local_328;
  value_type local_320;
  undefined1 local_318 [56];
  undefined1 local_2e0 [60];
  int local_2a4;
  int local_2a0;
  int local_29c;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined8 uStack_290;
  undefined8 local_288;
  value_type local_280;
  Option *in_stack_fffffffffffffd88;
  Mat *in_stack_fffffffffffffd90;
  Mat *in_stack_fffffffffffffd98;
  Mat *in_stack_fffffffffffffda0;
  Option *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  Mat *in_stack_fffffffffffffdc0;
  Mat *in_stack_fffffffffffffdc8;
  Mat *in_stack_fffffffffffffdd0;
  Mat *in_stack_fffffffffffffdd8;
  Mat *in_stack_fffffffffffffde0;
  Mat *in_stack_fffffffffffffde8;
  Mat *in_stack_fffffffffffffdf0;
  int local_204;
  undefined1 local_200 [56];
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  Mat local_190;
  undefined1 local_158 [56];
  undefined1 local_120 [56];
  undefined4 local_e8;
  undefined4 uStack_e4;
  Allocator *pAStack_e0;
  undefined8 local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  Mat local_b8;
  Mat local_80;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  long local_20;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  if ((local_34 % *(int *)((long)&in_RDI[3].data + 4) != 0) ||
     ((int)in_RDI[2].elemsize % *(int *)((long)&in_RDI[3].data + 4) != 0)) {
    return -100;
  }
  local_44 = *(int *)((long)&in_RDI[2].allocator + 4) *
             (*(int *)((long)&in_RDI[2].elemsize + 4) + -1) + 1;
  local_48 = in_RDI[2].dims * (*(int *)&in_RDI[2].allocator + -1) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_80,in_RSI);
  if (((in_RDI[7].elemsize & 1) != 0) && (local_40 != 1)) {
    Mat::Mat(&local_b8);
    Mat::create(in_RDI,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4
                ,CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                (Allocator *)in_stack_fffffffffffffca0);
    bVar1 = Mat::empty(in_stack_fffffffffffffca0);
    in_stack_fffffffffffffcbc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcbc);
    if (bVar1) {
      local_4 = -100;
      local_c8 = 1;
    }
    else {
      local_cc = local_34 / *(int *)((long)&in_RDI[3].data + 4);
      for (local_d0 = 0; local_d0 < *(int *)((long)&in_RDI[3].data + 4); local_d0 = local_d0 + 1) {
        local_d8 = local_28[2];
        _local_e8 = CONCAT44(1,(int)*local_28);
        pAStack_e0 = local_b8.allocator;
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                           (int)in_stack_fffffffffffffca0);
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                           (int)in_stack_fffffffffffffca0);
        ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             &in_RDI[7].allocator,(long)local_d0);
        (*(*ppLVar2)->_vptr_Layer[5])(*ppLVar2,local_120,local_158,&local_e8);
        Mat::~Mat((Mat *)0x1447d1);
        Mat::~Mat((Mat *)0x1447de);
      }
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     in_stack_fffffffffffffca0);
      local_c8 = 0;
    }
    Mat::~Mat((Mat *)0x144869);
    if (local_c8 != 0) goto LAB_001452a4;
  }
  Mat::Mat(&local_190,&local_80);
  if ((in_RDI[2].c < 1) && ((int)in_RDI[2].cstep < 1)) {
    if ((in_RDI[2].c == -0xe9) && ((int)in_RDI[2].cstep == -0xe9)) {
      local_194 = (local_44 + ((local_2c + -1) / in_RDI[2].w) * in_RDI[2].w) - local_2c;
      local_198 = (local_48 + ((local_30 + -1) / in_RDI[2].h) * in_RDI[2].h) - local_30;
      in_stack_fffffffffffffcb4 = local_44;
      in_stack_fffffffffffffcb8 = local_48;
      if ((0 < local_194) || (0 < local_198)) {
        in_stack_fffffffffffffca0 = (Mat *)local_28[2];
        in_stack_fffffffffffffca8 = *(undefined4 *)((long)local_28 + 4);
        copy_make_border((Mat *)bottom_blob_int8_g.data,(Mat *)bottom_blob_bordered.cstep,
                         bottom_blob_bordered.c,bottom_blob_bordered.h,bottom_blob_bordered.w,
                         bottom_blob_bordered.dims,(int)bottom_blob_int8_g.elemsize,
                         bottom_blob_bordered.allocator._4_4_,bottom_blob_int8_g.allocator,
                         bottom_blob_int8_g.dims);
        bVar1 = Mat::empty(in_stack_fffffffffffffca0);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00145286;
        }
      }
      local_2c = local_190.w;
      local_30 = local_190.h;
    }
LAB_00144b04:
    local_19c = (local_2c - local_44) / in_RDI[2].w + 1;
    local_1a0 = (local_30 - local_48) / in_RDI[2].h + 1;
    Mat::create(in_RDI,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4
                ,CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                (Allocator *)in_stack_fffffffffffffca0);
    bVar1 = Mat::empty(in_stack_fffffffffffffca0);
    if (bVar1) {
      local_4 = -100;
    }
    else if ((local_34 == *(int *)((long)&in_RDI[3].data + 4)) &&
            (*(int *)((long)&in_RDI[3].data + 4) == (int)in_RDI[2].elemsize)) {
      if ((in_RDI[7].elemsize & 1) == 0) {
        if ((((*(int *)((long)&in_RDI[2].elemsize + 4) != 3) || (*(int *)&in_RDI[2].allocator != 3))
            || (*(int *)((long)&in_RDI[2].allocator + 4) != 1)) || (in_RDI[2].dims != 1))
        goto LAB_00144f67;
        if ((in_RDI[2].w == 1) && (in_RDI[2].h == 1)) {
          convdw3x3s1_sse(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                          in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (Option *)in_stack_fffffffffffffdd0);
          local_4 = 0;
        }
        else {
          if ((in_RDI[2].w != 2) || (in_RDI[2].h != 2)) goto LAB_00144f67;
          convdw3x3s2_sse(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                          in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                          in_stack_fffffffffffffdb0);
          local_4 = 0;
        }
      }
      else if ((((*(int *)((long)&in_RDI[2].elemsize + 4) == 3) &&
                (*(int *)&in_RDI[2].allocator == 3)) &&
               ((*(int *)((long)&in_RDI[2].allocator + 4) == 1 && (in_RDI[2].dims == 1)))) &&
              (((in_RDI[2].w == 1 && (in_RDI[2].h == 1)) ||
               ((in_RDI[2].w == 2 && (in_RDI[2].h == 2)))))) {
        if ((in_RDI[2].w == 1) && (in_RDI[2].h == 1)) {
          convdw3x3s1_int8_sse
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
        }
        else if ((in_RDI[2].w == 2) && (in_RDI[2].h == 2)) {
          convdw3x3s2_int8_sse
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
        }
        for (local_1a4 = 0; local_1a4 < *(int *)((long)&in_RDI[3].data + 4);
            local_1a4 = local_1a4 + 1) {
          local_1b8 = local_28[2];
          _local_1c8 = CONCAT44(1,(int)*local_28);
          uStack_1c0 = *(undefined8 *)(local_20 + 0x18);
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       (int)((ulong)in_stack_fffffffffffffca0 >> 0x20));
          ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               &in_RDI[7].cstep,(long)local_1a4);
          (*(*ppLVar2)->_vptr_Layer[7])(*ppLVar2,local_200,&local_1c8);
          Mat::~Mat((Mat *)0x144de3);
        }
        local_4 = 0;
      }
      else {
LAB_00144f67:
        for (local_204 = 0; local_204 < *(int *)((long)&in_RDI[3].data + 4);
            local_204 = local_204 + 1) {
          Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                             (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                             (int)in_stack_fffffffffffffca0);
          Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                             (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                             (int)in_stack_fffffffffffffca0);
          ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               &in_RDI[8].elemsize,(long)local_204);
          local_280 = *ppLVar2;
          local_288 = local_28[2];
          local_298 = *(undefined4 *)local_28;
          uStack_294 = 1;
          uStack_290 = *(undefined8 *)(local_20 + 0x18);
          (*local_280->_vptr_Layer[5])
                    (local_280,&stack0xfffffffffffffdc0,&stack0xfffffffffffffd88,&local_298);
          Mat::~Mat((Mat *)0x14506a);
          Mat::~Mat((Mat *)0x145077);
        }
        local_4 = 0;
      }
    }
    else {
      local_29c = local_34 / *(int *)((long)&in_RDI[3].data + 4);
      local_2a0 = (int)in_RDI[2].elemsize / *(int *)((long)&in_RDI[3].data + 4);
      for (local_2a4 = 0; local_2a4 < *(int *)((long)&in_RDI[3].data + 4); local_2a4 = local_2a4 + 1
          ) {
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                           (int)in_stack_fffffffffffffca0);
        Mat::channel_range((Mat *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
                           (int)in_stack_fffffffffffffca0);
        ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             &in_RDI[8].elemsize,(long)local_2a4);
        local_320 = *ppLVar2;
        local_328 = local_28[2];
        local_338 = *(undefined4 *)local_28;
        uStack_334 = *(undefined4 *)((long)local_28 + 4);
        uStack_330 = *(undefined8 *)(local_20 + 0x18);
        (*local_320->_vptr_Layer[5])(local_320,local_2e0,local_318,&local_338);
        Mat::~Mat((Mat *)0x14520a);
        Mat::~Mat((Mat *)0x145217);
      }
      local_4 = 0;
    }
  }
  else {
    in_stack_fffffffffffffca0 = (Mat *)local_28[2];
    in_stack_fffffffffffffca8 = *(undefined4 *)((long)local_28 + 4);
    copy_make_border((Mat *)bottom_blob_int8_g.data,(Mat *)bottom_blob_bordered.cstep,
                     bottom_blob_bordered.c,bottom_blob_bordered.h,bottom_blob_bordered.w,
                     bottom_blob_bordered.dims,(int)bottom_blob_int8_g.elemsize,
                     bottom_blob_bordered.allocator._4_4_,bottom_blob_int8_g.allocator,
                     bottom_blob_int8_g.dims);
    bVar1 = Mat::empty(in_stack_fffffffffffffca0);
    in_stack_fffffffffffffcbc =
         CONCAT13((char)((uint)in_stack_fffffffffffffcbc >> 0x18),
                  CONCAT12(bVar1,(short)in_stack_fffffffffffffcbc));
    if (!bVar1) {
      local_2c = local_190.w;
      local_30 = local_190.h;
      goto LAB_00144b04;
    }
    local_4 = -100;
  }
LAB_00145286:
  local_c8 = 1;
  Mat::~Mat((Mat *)0x145293);
LAB_001452a4:
  Mat::~Mat((Mat *)0x1452b1);
  return local_4;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (use_int8_inference)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                {
                    if (stride_w == 1 && stride_h == 1)
                    {
                        convdw3x3s1_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }
                    else if (stride_w == 2 && stride_h == 2)
                    {
                        convdw3x3s2_int8_sse(bottom_blob_bordered, top_blob, weight_data, opt);
                    }

                    // dequantize, reverse scale inplace
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int g=0; g<group; g++)
                    {
                        ncnn::Option opt_g = opt;
                        opt_g.num_threads = 1;
                        opt_g.blob_allocator = top_blob.allocator;

                        Mat top_blob_g = top_blob.channel(g);
                        dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                    }

                    return 0;
                }
            }
        }
        else
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
            {
                if (stride_w == 1 && stride_h == 1)
                {
                    convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
                else if (stride_w == 2 && stride_h == 2)
                {
                    convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
                    return 0;
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

            // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        ncnn::Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}